

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# document.hpp
# Opt level: O3

void __thiscall
Path::stroke(Path *this,vector<Shape,_std::allocator<Shape>_> *shapes,float width,
            shared_ptr<Paint> *paint)

{
  Point *p1;
  ulong uVar1;
  pointer pPVar2;
  vector<Point,_std::allocator<Point>_> *points;
  pointer pSVar3;
  long lVar4;
  long lVar5;
  Shape *shape;
  float offset;
  Subpath local_58;
  pointer local_38;
  
  std::vector<Shape,std::allocator<Shape>>::emplace_back<std::shared_ptr<Paint>const&>
            ((vector<Shape,std::allocator<Shape>> *)shapes,paint);
  pSVar3 = (this->subpaths).super__Vector_base<Subpath,_std::allocator<Subpath>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_38 = (this->subpaths).super__Vector_base<Subpath,_std::allocator<Subpath>_>._M_impl.
             super__Vector_impl_data._M_finish;
  if (pSVar3 != local_38) {
    shape = (shapes->super__Vector_base<Shape,_std::allocator<Shape>_>)._M_impl.
            super__Vector_impl_data._M_finish + -1;
    offset = width * 0.5;
    do {
      local_58.points.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
      local_58.points.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._1_7_ = 0;
      local_58.closed = false;
      local_58.points.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_58.points.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
      super__Vector_impl_data._M_finish._0_1_ = 0;
      local_58.points.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
      super__Vector_impl_data._M_finish._1_7_ = 0;
      p1 = (pSVar3->points).super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
           super__Vector_impl_data._M_start;
      pPVar2 = (pSVar3->points).super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
               super__Vector_impl_data._M_finish;
      if (8 < (ulong)((long)pPVar2 - (long)p1)) {
        uVar1 = 1;
        lVar4 = 8;
        do {
          Subpath::push_offset_segment
                    (&local_58,(Point *)((long)&p1[-1].x + lVar4),(Point *)((long)&p1->x + lVar4),
                     offset);
          uVar1 = uVar1 + 1;
          p1 = (pSVar3->points).super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
               super__Vector_impl_data._M_start;
          pPVar2 = (pSVar3->points).super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
                   super__Vector_impl_data._M_finish;
          lVar4 = lVar4 + 8;
        } while (uVar1 < (ulong)((long)pPVar2 - (long)p1 >> 3));
      }
      if (pSVar3->closed != false) {
        Subpath::push_offset_segment(&local_58,pPVar2 + -1,p1,offset);
        local_58.closed = true;
        fill_subpath(this,&local_58,shape);
        pPVar2 = local_58.points.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
                 super__Vector_impl_data._M_start;
        lVar4 = CONCAT71(local_58.points.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage._1_7_,
                         local_58.points.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage._0_1_);
        local_58.points.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_58.points.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
        super__Vector_impl_data._M_finish._0_1_ = 0;
        local_58.points.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
        super__Vector_impl_data._M_finish._1_7_ = 0;
        local_58.points.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
        local_58.points.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._1_7_ = 0;
        if (pPVar2 != (pointer)0x0) {
          operator_delete(pPVar2,lVar4 - (long)pPVar2);
        }
        local_58.closed = false;
        Subpath::push_offset_segment
                  (&local_58,
                   (pSVar3->points).super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
                   super__Vector_impl_data._M_start,
                   (pSVar3->points).super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
                   super__Vector_impl_data._M_finish + -1,offset);
        p1 = (pSVar3->points).super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
             super__Vector_impl_data._M_start;
        pPVar2 = (pSVar3->points).super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      }
      lVar5 = (long)pPVar2 - (long)p1 >> 3;
      lVar4 = ((long)pPVar2 - (long)p1) + -0x10;
      while (lVar5 = lVar5 + -1, lVar5 != 0) {
        pPVar2 = (pSVar3->points).super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
                 super__Vector_impl_data._M_start;
        Subpath::push_offset_segment
                  (&local_58,(Point *)((long)&pPVar2[1].x + lVar4),
                   (Point *)((long)&pPVar2->x + lVar4),offset);
        lVar4 = lVar4 + -8;
      }
      local_58.closed = true;
      fill_subpath(this,&local_58,shape);
      if (local_58.points.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_58.points.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        CONCAT71(local_58.points.super__Vector_base<Point,_std::allocator<Point>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage._1_7_,
                                 local_58.points.super__Vector_base<Point,_std::allocator<Point>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage._0_1_) -
                        (long)local_58.points.super__Vector_base<Point,_std::allocator<Point>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      pSVar3 = pSVar3 + 1;
    } while (pSVar3 != local_38);
  }
  return;
}

Assistant:

void stroke(std::vector<Shape>& shapes, float width, const std::shared_ptr<Paint>& paint) const {
		shapes.emplace_back(paint);
		Shape& shape = shapes.back();
		const float offset = width / 2.f;
		for (const Subpath& subpath: subpaths) {
			const std::vector<Point>& points = subpath.points;
			Subpath new_subpath;
			for (size_t i = 1; i < points.size(); ++i) {
				new_subpath.push_offset_segment(points[i-1], points[i], offset);
			}
			if (subpath.closed) {
				new_subpath.push_offset_segment(points.back(), points.front(), offset);
				new_subpath.closed = true;
				fill_subpath(new_subpath, shape);
				new_subpath = Subpath();
				new_subpath.push_offset_segment(points.front(), points.back(), offset);
			}
			for (size_t i = points.size() - 1; i > 0; --i) {
				new_subpath.push_offset_segment(points[i], points[i-1], offset);
			}
			new_subpath.closed = true;
			fill_subpath(new_subpath, shape);
		}
	}